

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Opnd * __thiscall
Lowerer::LoadSlotArrayWithCachedLocalType
          (Lowerer *this,Instr *instrInsert,PropertySymOpnd *propertySymOpnd)

{
  code *pcVar1;
  bool bVar2;
  DWORD offset;
  StackSym *sym;
  undefined4 *puVar3;
  IndirOpnd *src;
  Opnd *opndIndir;
  StackSym *auxSlotPtrSym;
  RegOpnd *opndSlotArray;
  RegOpnd *opndBase;
  PropertySymOpnd *propertySymOpnd_local;
  Instr *instrInsert_local;
  Lowerer *this_local;
  
  this_local = (Lowerer *)
               IR::SymOpnd::CreatePropertyOwnerOpnd(&propertySymOpnd->super_SymOpnd,this->m_func);
  bVar2 = IR::PropertySymOpnd::UsesAuxSlot(propertySymOpnd);
  if (bVar2) {
    bVar2 = IR::PropertySymOpnd::IsAuxSlotPtrSymAvailable(propertySymOpnd);
    if ((bVar2) || (bVar2 = IR::PropertySymOpnd::ProducesAuxSlotPtr(propertySymOpnd), bVar2)) {
      sym = IR::PropertySymOpnd::GetAuxSlotPtrSym(propertySymOpnd);
      if (sym == (StackSym *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x6f03,"(auxSlotPtrSym != nullptr)","auxSlotPtrSym != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      auxSlotPtrSym = (StackSym *)IR::RegOpnd::New(sym,TyInt64,this->m_func);
      IR::Opnd::SetIsJITOptimizedReg((Opnd *)auxSlotPtrSym,true);
      bVar2 = IR::PropertySymOpnd::ProducesAuxSlotPtr(propertySymOpnd);
      if (!bVar2) {
        return (Opnd *)auxSlotPtrSym;
      }
    }
    else {
      auxSlotPtrSym = (StackSym *)IR::RegOpnd::New(TyInt64,this->m_func);
    }
    offset = Js::DynamicObject::GetOffsetOfAuxSlots();
    src = IR::IndirOpnd::New((RegOpnd *)this_local,offset,TyInt64,this->m_func,false);
    InsertMove((Opnd *)auxSlotPtrSym,&src->super_Opnd,instrInsert,true);
    this_local = (Lowerer *)auxSlotPtrSym;
  }
  return (Opnd *)this_local;
}

Assistant:

IR::Opnd *
Lowerer::LoadSlotArrayWithCachedLocalType(IR::Instr * instrInsert, IR::PropertySymOpnd *propertySymOpnd)
{
    IR::RegOpnd *opndBase = propertySymOpnd->CreatePropertyOwnerOpnd(m_func);
    if (propertySymOpnd->UsesAuxSlot())
    {
        // If we use the auxiliary slot array, load it and return it
        IR::RegOpnd * opndSlotArray;
        if (propertySymOpnd->IsAuxSlotPtrSymAvailable() || propertySymOpnd->ProducesAuxSlotPtr())
        {
            // We want to reload and/or reuse the shared aux slot ptr sym
            StackSym * auxSlotPtrSym = propertySymOpnd->GetAuxSlotPtrSym();
            Assert(auxSlotPtrSym != nullptr);

            opndSlotArray = IR::RegOpnd::New(auxSlotPtrSym, TyMachReg, this->m_func);
            opndSlotArray->SetIsJITOptimizedReg(true);
            if (!propertySymOpnd->ProducesAuxSlotPtr())
            {
                // No need to reload
                return opndSlotArray;
            }
        }
        else
        {
            opndSlotArray = IR::RegOpnd::New(TyMachReg, this->m_func);
        }
        IR::Opnd *opndIndir = IR::IndirOpnd::New(opndBase, Js::DynamicObject::GetOffsetOfAuxSlots(), TyMachReg, this->m_func);
        Lowerer::InsertMove(opndSlotArray, opndIndir, instrInsert);

        return opndSlotArray;
    }
    else
    {
        // If we use inline slot return the address to the object header
        return opndBase;
    }
}